

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O2

void DNA::fromCStr(Base *dest,size_t dest_size,char *src)

{
  char cVar1;
  size_t sVar2;
  Base BVar3;
  
  sVar2 = 0;
  do {
    if (dest_size == sVar2) {
      return;
    }
    cVar1 = src[sVar2];
    BVar3 = A;
    if (cVar1 == 'A') {
LAB_0010122a:
      *dest = BVar3;
      dest = dest + 1;
    }
    else {
      if (cVar1 == 'C') {
LAB_0010121d:
        BVar3 = C;
        goto LAB_0010122a;
      }
      if (cVar1 == 'G') {
LAB_00101222:
        BVar3 = G;
        goto LAB_0010122a;
      }
      if (cVar1 == 'T') {
LAB_00101227:
        BVar3 = T;
        goto LAB_0010122a;
      }
      if (cVar1 == 'a') goto LAB_0010122a;
      if (cVar1 == 'c') goto LAB_0010121d;
      if (cVar1 == 'g') goto LAB_00101222;
      if (cVar1 == 't') goto LAB_00101227;
      if (cVar1 == '\0') {
        return;
      }
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

void DNA::fromCStr(DNA::Base* dest, size_t dest_size, const char* src)
{
    while (dest_size-- && *src) {
        switch (*src) {
            case 'a':
            case 'A':
                *dest++ = A;
                break;
            case 'c':
            case 'C':
                *dest++ = C;
                break;
            case 'g':
            case 'G':
                *dest++ = G;
                break;
            case 't':
            case 'T':
                *dest++ = T;
                break;
            default:
                // Ignore non DNA chars
                break;
        }
        ++src;
    }
}